

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_aggregate_function_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateAggregateFunctionInfo::Copy(CreateAggregateFunctionInfo *this)

{
  type other;
  CreateFunctionInfo *in_RSI;
  _func_int **local_20;
  
  make_uniq<duckdb::CreateAggregateFunctionInfo,duckdb::AggregateFunctionSet_const&>
            ((duckdb *)&local_20,(AggregateFunctionSet *)(in_RSI + 1));
  other = unique_ptr<duckdb::CreateAggregateFunctionInfo,_std::default_delete<duckdb::CreateAggregateFunctionInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreateAggregateFunctionInfo,_std::default_delete<duckdb::CreateAggregateFunctionInfo>,_true>
                       *)&local_20);
  CreateFunctionInfo::CopyFunctionProperties(in_RSI,&other->super_CreateFunctionInfo);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo = local_20;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateAggregateFunctionInfo::Copy() const {
	auto result = make_uniq<CreateAggregateFunctionInfo>(functions);
	CopyFunctionProperties(*result);
	return std::move(result);
}